

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Dropout_x86::forward_inplace(Dropout_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  
  fVar2 = *(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86[-3]);
  if (fVar2 != 1.0) {
    if (bottom_top_blob->elempack != 4) {
      iVar12 = Dropout::forward_inplace
                         ((Dropout *)
                          ((long)&this->_vptr_Dropout_x86 + (long)this->_vptr_Dropout_x86[-3]),
                          bottom_top_blob,opt);
      return iVar12;
    }
    iVar12 = bottom_top_blob->dims;
    uVar3 = bottom_top_blob->w;
    uVar4 = bottom_top_blob->h;
    if (iVar12 == 3) {
      uVar11 = bottom_top_blob->c;
      if (0 < (int)uVar11) {
        uVar9 = 0;
        do {
          if (0 < (int)(uVar4 * uVar3)) {
            pfVar10 = (float *)(bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                               (long)bottom_top_blob->data);
            iVar12 = uVar4 * uVar3;
            do {
              *pfVar10 = *pfVar10 * fVar2;
              pfVar10[1] = pfVar10[1] * fVar2;
              pfVar10[2] = pfVar10[2] * fVar2;
              pfVar10[3] = pfVar10[3] * fVar2;
              pfVar10 = pfVar10 + 4;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar11);
      }
    }
    else if (iVar12 == 2) {
      if (0 < (int)uVar4) {
        uVar9 = 0;
        do {
          if (0 < (int)uVar3) {
            pfVar10 = (float *)((long)bottom_top_blob->w * uVar9 * bottom_top_blob->elemsize +
                               (long)bottom_top_blob->data);
            uVar13 = (ulong)uVar3;
            do {
              *pfVar10 = *pfVar10 * fVar2;
              pfVar10[1] = pfVar10[1] * fVar2;
              pfVar10[2] = pfVar10[2] * fVar2;
              pfVar10[3] = pfVar10[3] * fVar2;
              pfVar10 = pfVar10 + 4;
              uVar11 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar11;
            } while (uVar11 != 0);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar4);
      }
    }
    else if ((iVar12 == 1) && (0 < (int)uVar3)) {
      lVar8 = 0;
      do {
        pfVar10 = (float *)((long)bottom_top_blob->data + lVar8);
        fVar5 = pfVar10[1];
        fVar6 = pfVar10[2];
        fVar7 = pfVar10[3];
        pfVar1 = (float *)((long)bottom_top_blob->data + lVar8);
        *pfVar1 = *pfVar10 * fVar2;
        pfVar1[1] = fVar5 * fVar2;
        pfVar1[2] = fVar6 * fVar2;
        pfVar1[3] = fVar7 * fVar2;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)uVar3 << 4 != lVar8);
    }
  }
  return 0;
}

Assistant:

int Dropout_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}